

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt __thiscall llvm::APInt::byteSwap(APInt *this)

{
  ulong uVar1;
  ulong uVar2;
  long in_RDX;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  uint uVar3;
  ulong *in_RSI;
  APInt AVar4;
  
  uVar3 = (uint)in_RSI[1];
  if ((uVar3 < 0x10) || ((uVar3 & 0xf) != 0)) {
    __assert_fail("BitWidth >= 16 && BitWidth % 16 == 0 && \"Cannot byteswap!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x269,"APInt llvm::APInt::byteSwap() const");
  }
  switch(uVar3 - 0x10 >> 4) {
  case 0:
    uVar2 = (ulong)(ushort)((ushort)*in_RSI << 8 | (ushort)*in_RSI >> 8);
    this->BitWidth = 0x10;
    break;
  case 1:
    uVar3 = (uint)*in_RSI;
    uVar2 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18)
    ;
    this->BitWidth = 0x20;
    break;
  case 2:
    uVar2 = *in_RSI;
    APInt(this,uVar3,
          ((uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
           (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
          uVar2 << 0x38) >> 0x10,false);
    in_RDX = extraout_RDX;
    goto LAB_0019a22c;
  case 3:
    uVar2 = *in_RSI;
    uVar2 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
            (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
            (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    this->BitWidth = 0x40;
    break;
  default:
    APInt(this,uVar3 + 0x3f & 0xffffffc0,0,false);
    uVar3 = (uint)in_RSI[1];
    in_RDX = extraout_RDX_00;
    if ((ulong)uVar3 != 0) {
      uVar2 = (ulong)uVar3 + 0x3f >> 6;
      in_RDX = 0;
      do {
        uVar2 = uVar2 - 1;
        uVar1 = *(ulong *)(*in_RSI + (uVar2 & 0xffffffff) * 8);
        *(ulong *)((long)(this->U).pVal + in_RDX) =
             uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
        in_RDX = in_RDX + 8;
      } while (uVar2 != 0);
    }
    uVar3 = this->BitWidth - uVar3;
    if (uVar3 != 0) {
      lshrInPlace(this,uVar3);
      this->BitWidth = (uint)in_RSI[1];
      in_RDX = extraout_RDX_01;
    }
    goto LAB_0019a22c;
  }
  (this->U).VAL = uVar2;
LAB_0019a22c:
  AVar4._8_8_ = in_RDX;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt APInt::byteSwap() const {
  assert(BitWidth >= 16 && BitWidth % 16 == 0 && "Cannot byteswap!");
  if (BitWidth == 16)
    return APInt(BitWidth, ByteSwap_16(uint16_t(U.VAL)));
  if (BitWidth == 32)
    return APInt(BitWidth, ByteSwap_32(unsigned(U.VAL)));
  if (BitWidth == 48) {
    unsigned Tmp1 = unsigned(U.VAL >> 16);
    Tmp1 = ByteSwap_32(Tmp1);
    uint16_t Tmp2 = uint16_t(U.VAL);
    Tmp2 = ByteSwap_16(Tmp2);
    return APInt(BitWidth, (uint64_t(Tmp2) << 32) | Tmp1);
  }
  if (BitWidth == 64)
    return APInt(BitWidth, ByteSwap_64(U.VAL));

  APInt Result(getNumWords() * APINT_BITS_PER_WORD, 0);
  for (unsigned I = 0, N = getNumWords(); I != N; ++I)
    Result.U.pVal[I] = ByteSwap_64(U.pVal[N - I - 1]);
  if (Result.BitWidth != BitWidth) {
    Result.lshrInPlace(Result.BitWidth - BitWidth);
    Result.BitWidth = BitWidth;
  }
  return Result;
}